

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::beginAnimatedOperation(QTreeViewPrivate *this)

{
  AnimatedOperation *this_00;
  uint uVar1;
  QAbstractItemView *this_01;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint item;
  ulong uVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  Representation local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QAbstractItemView **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  QVar8 = QWidget::rect((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        viewport);
  this_00 = &this->animatedOperation;
  iVar2 = AnimatedOperation::top(this_00);
  local_68 = QVar8.x1.m_i;
  iVar3 = QAbstractAnimation::direction();
  RVar7 = QVar8.y2.m_i;
  if (iVar3 == 0) {
    iVar3 = (this->animatedOperation).item;
    uVar6 = (ulong)iVar3;
    uVar1 = *(uint *)&(this->viewItems).d.ptr[uVar6].field_0x1c;
    for (iVar5 = 0;
        ((int)uVar6 < (int)((uVar1 >> 4) + iVar3) && (iVar5 < (RVar7.m_i - iVar2) * 2 + 2));
        iVar5 = iVar5 + iVar4) {
      item = (int)uVar6 + 1;
      uVar6 = (ulong)item;
      iVar4 = itemHeight(this,item);
    }
    RVar7.m_i = iVar5 + iVar2 + -1;
    iVar3 = AnimatedOperation::top(this_00);
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffa8,iVar5 + iVar3);
    QVariantAnimation::setEndValue((QVariant *)this_00);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffa8);
  }
  if ((local_68.m_i <= QVar8.x2.m_i.m_i) && (iVar2 <= RVar7.m_i)) {
    renderTreeToPixmapForAnimation((QTreeViewPrivate *)&stack0xffffffffffffffa8,(QRect *)this);
    QPixmap::operator=(&(this->animatedOperation).after,(QPixmap *)&stack0xffffffffffffffa8);
    QPixmap::~QPixmap((QPixmap *)&stack0xffffffffffffffa8);
    QAbstractItemView::setState(this_01,AnimatingState);
    QAbstractAnimation::start((DeletionPolicy)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::beginAnimatedOperation()
{
    Q_Q(QTreeView);

    QRect rect = viewport->rect();
    rect.setTop(animatedOperation.top());
    if (animatedOperation.direction() == QVariantAnimation::Forward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = animatedOperation.item + viewItems.at(animatedOperation.item).total + 1;
        for (int i = animatedOperation.item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(animatedOperation.top() + h);
    }

    if (!rect.isEmpty()) {
        animatedOperation.after = renderTreeToPixmapForAnimation(rect);

        q->setState(QAbstractItemView::AnimatingState);
        animatedOperation.start(); //let's start the animation
    }
}